

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

ValidationContext __thiscall
VmaBlockBufferImageGranularity::StartValidation
          (VmaBlockBufferImageGranularity *this,VkAllocationCallbacks *pAllocationCallbacks,
          bool isVirutal)

{
  ValidationContext VVar1;
  bool bVar2;
  byte in_DL;
  VkAllocationCallbacks *in_RSI;
  VkAllocationCallbacks *in_RDI;
  ValidationContext ctx;
  size_t in_stack_ffffffffffffffc8;
  unsigned_short *local_8;
  
  local_8 = (unsigned_short *)0x0;
  if (((in_DL & 1) == 0) && (bVar2 = IsEnabled((VmaBlockBufferImageGranularity *)in_RDI), bVar2)) {
    local_8 = VmaAllocateArray<unsigned_short>(in_RDI,in_stack_ffffffffffffffc8);
    memset(local_8,0,(ulong)*(uint *)&in_RDI->pfnAllocation << 1);
  }
  VVar1.pageAllocs = local_8;
  VVar1.allocCallbacks = in_RSI;
  return VVar1;
}

Assistant:

VmaBlockBufferImageGranularity::ValidationContext VmaBlockBufferImageGranularity::StartValidation(
    const VkAllocationCallbacks* pAllocationCallbacks, bool isVirutal) const
{
    ValidationContext ctx{ pAllocationCallbacks, VMA_NULL };
    if (!isVirutal && IsEnabled())
    {
        ctx.pageAllocs = vma_new_array(pAllocationCallbacks, uint16_t, m_RegionCount);
        memset(ctx.pageAllocs, 0, m_RegionCount * sizeof(uint16_t));
    }
    return ctx;
}